

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O3

void tcu::writeXmlCaselistsToFiles(TestPackageRoot *root,TestContext *testCtx,CommandLine *cmdLine)

{
  TestNodeType TVar1;
  char *__s;
  State SVar2;
  deBool dVar3;
  TestNode *pTVar4;
  FILE *outputFile;
  qpXmlWriter *writer;
  Exception *pEVar5;
  uint uVar6;
  string caseName;
  qpXmlAttribute attribs [2];
  string description;
  string filename;
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  DefaultHierarchyInflater inflater;
  TestHierarchyIterator iter;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  undefined4 local_140;
  pointer local_138;
  undefined8 local_130;
  char *local_128;
  undefined4 local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  undefined8 local_110;
  string local_108;
  FILE *local_e8;
  string local_e0;
  char *local_c0;
  UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> local_b8;
  DefaultHierarchyInflater local_a8;
  string local_98;
  TestHierarchyIterator local_78;
  
  DefaultHierarchyInflater::DefaultHierarchyInflater(&local_a8,testCtx);
  CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_168,
             testCtx->m_cmdLine,testCtx->m_curArchive);
  local_b8.m_data.ptr = (CaseListFilter *)local_168._0_8_;
  local_168._0_8_ = (CaseListFilter *)0x0;
  de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::reset
            ((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)local_168)
  ;
  TestHierarchyIterator::TestHierarchyIterator
            (&local_78,root,&local_a8.super_TestHierarchyInflater,local_b8.m_data.ptr);
  local_c0 = CommandLine::getCaseListExportFile(cmdLine);
  while( true ) {
    SVar2 = TestHierarchyIterator::getState(&local_78);
    if (SVar2 == STATE_FINISHED) {
      TestHierarchyIterator::~TestHierarchyIterator(&local_78);
      de::details::
      UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::reset
                (&local_b8);
      DefaultHierarchyInflater::~DefaultHierarchyInflater(&local_a8);
      return;
    }
    pTVar4 = TestHierarchyIterator::getNode(&local_78);
    __s = (pTVar4->m_name)._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,local_c0,(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,__s,&local_189);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"xml","");
    makePackageFilename(&local_e0,(string *)local_168,&local_188,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((CaseListFilter *)local_168._0_8_ != (CaseListFilter *)local_158) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
    }
    outputFile = fopen(local_e0._M_dataplus._M_p,"wb");
    if (outputFile == (FILE *)0x0) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     "Failed to open ",&local_e0);
      Exception::Exception(pEVar5,(string *)local_168);
      __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
    }
    local_e8 = outputFile;
    writer = qpXmlWriter_createFileWriter((FILE *)outputFile,0,0);
    if (writer == (qpXmlWriter *)0x0) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
      local_168._0_8_ = local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"XML writer creation failed","");
      Exception::Exception(pEVar5,(string *)local_168);
      __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
    }
    print("Writing test cases from \'%s\' to file \'%s\'..\n",__s,local_e0._M_dataplus._M_p);
    pTVar4 = TestHierarchyIterator::getNode(&local_78);
    local_158._0_8_ = (pTVar4->m_name)._M_dataplus._M_p;
    local_168._0_8_ = "PackageName";
    local_168._8_4_ = QP_XML_ATTRIBUTE_STRING;
    local_158._8_8_ = (CasePaths *)0xfffffffffffffd5a;
    local_138 = (pTVar4->m_description)._M_dataplus._M_p;
    local_158._16_8_ = "Description";
    local_140 = 0;
    local_130 = 0xfffffffffffffd5a;
    dVar3 = qpXmlWriter_startDocument(writer);
    if (dVar3 == 0) break;
    dVar3 = qpXmlWriter_startElement(writer,"TestCaseList",2,(qpXmlAttribute *)local_168);
    if (dVar3 == 0) break;
    TestHierarchyIterator::next(&local_78);
    pTVar4 = TestHierarchyIterator::getNode(&local_78);
    while (pTVar4->m_nodeType != NODETYPE_PACKAGE) {
      pTVar4 = TestHierarchyIterator::getNode(&local_78);
      TVar1 = pTVar4->m_nodeType;
      SVar2 = TestHierarchyIterator::getState(&local_78);
      if (SVar2 == STATE_ENTER_NODE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,(pTVar4->m_name)._M_dataplus._M_p,
                   (allocator<char> *)local_168);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,(pTVar4->m_description)._M_dataplus._M_p,
                   (allocator<char> *)local_168);
        local_168._0_8_ = "Name";
        local_168._8_4_ = QP_XML_ATTRIBUTE_STRING;
        local_158._0_8_ = local_188._M_dataplus._M_p;
        local_158._8_8_ = (CasePaths *)0xfffffffffffffd5a;
        uVar6 = TVar1 - NODETYPE_GROUP;
        if (uVar6 < 5) {
          local_138 = &DAT_01cd4ac4 + *(int *)(&DAT_01cd4ac4 + (ulong)uVar6 * 4);
        }
        else {
          local_138 = (pointer)0x0;
        }
        local_158._16_8_ = "CaseType";
        local_140 = 0;
        local_130 = 0xfffffffffffffd5a;
        local_128 = "Description";
        local_120 = 0;
        local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p;
        local_110 = 0xfffffffffffffd5a;
        dVar3 = qpXmlWriter_startElement(writer,"TestCase",3,(qpXmlAttribute *)local_168);
        if (dVar3 == 0) {
          pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"Writing to case list file failed","");
          Exception::Exception(pEVar5,&local_98);
          __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        dVar3 = qpXmlWriter_endElement(writer,"TestCase");
        if (dVar3 == 0) {
          pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
          local_168._0_8_ = local_158;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,"Writing to case list file failed","");
          Exception::Exception(pEVar5,(string *)local_168);
          __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
        }
      }
      TestHierarchyIterator::next(&local_78);
      pTVar4 = TestHierarchyIterator::getNode(&local_78);
    }
    dVar3 = qpXmlWriter_endElement(writer,"TestCaseList");
    if (dVar3 == 0) {
LAB_019cdced:
      pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
      local_168._0_8_ = local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"Failed to terminate XML document","");
      Exception::Exception(pEVar5,(string *)local_168);
      __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
    }
    dVar3 = qpXmlWriter_endDocument(writer);
    if (dVar3 == 0) goto LAB_019cdced;
    qpXmlWriter_destroy(writer);
    fclose(local_e8);
    TestHierarchyIterator::next(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,"Failed to start XML document","");
  Exception::Exception(pEVar5,&local_188);
  __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void writeXmlCaselistsToFiles (TestPackageRoot& root, TestContext& testCtx, const CommandLine& cmdLine)
{
	DefaultHierarchyInflater			inflater		(testCtx);
	de::MovePtr<const CaseListFilter>	caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()));

	TestHierarchyIterator				iter			(root, inflater, *caseListFilter);
	const char* const					filenamePattern = cmdLine.getCaseListExportFile();

	while (iter.getState() != TestHierarchyIterator::STATE_FINISHED)
	{
		const TestNode* node		= iter.getNode();
		const char*		pkgName		= node->getName();
		const string	filename	= makePackageFilename(filenamePattern, pkgName, "xml");

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE &&
				  node->getNodeType() == NODETYPE_PACKAGE);

		FILE*			file	= DE_NULL;
		qpXmlWriter*	writer	= DE_NULL;

		try
		{
			file = fopen(filename.c_str(), "wb");
			if (!file)
				throw Exception("Failed to open " + filename);

			writer = qpXmlWriter_createFileWriter(file, DE_FALSE, DE_FALSE);
			if (!writer)
				throw Exception("XML writer creation failed");

			print("Writing test cases from '%s' to file '%s'..\n", pkgName, filename.c_str());

			writeXmlCaselist(iter, writer);

			qpXmlWriter_destroy(writer);
			writer = DE_NULL;

			fclose(file);
			file = DE_NULL;
		}
		catch (...)
		{
			if (writer)
				qpXmlWriter_destroy(writer);
			if (file)
				fclose(file);
			throw;
		}

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
				  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);
		iter.next();
	}
}